

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexConcaveCollisionAlgorithm.cpp
# Opt level: O1

void __thiscall
cbtConvexConcaveCollisionAlgorithm::calculateTimeOfImpact::LocalTriangleSphereCastCallback::
processTriangle(LocalTriangleSphereCastCallback *this,cbtVector3 *triangle,int partId,
               int triangleIndex)

{
  bool bVar1;
  CProfileSample __profile;
  cbtSphereShape pointShape;
  cbtSubsimplexConvexCast convexCaster;
  cbtTransform ident;
  CastResult castResult;
  cbtTriangleShape triShape;
  cbtVoronoiSimplexSolver simplexSolver;
  CProfileSample local_36d;
  cbtScalar local_36c;
  cbtConvexInternalShape local_368;
  cbtSubsimplexConvexCast local_320;
  cbtTransform local_300;
  CastResult local_2c0;
  cbtPolyhedralConvexShape local_1f8;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  cbtVoronoiSimplexSolver local_178;
  
  CProfileSample::CProfileSample(&local_36d,"processTriangle");
  local_300.m_basis.m_el[0].m_floats[0] = 1.0;
  local_300.m_basis.m_el[0].m_floats[1] = 0.0;
  local_300.m_basis.m_el[0].m_floats[2] = 0.0;
  local_300.m_basis.m_el[0].m_floats[3] = 0.0;
  local_300.m_basis.m_el[1].m_floats[0] = 0.0;
  local_300.m_basis.m_el[1].m_floats[1] = 1.0;
  local_300.m_basis.m_el[1].m_floats[2] = 0.0;
  local_300.m_basis.m_el[1].m_floats[3] = 0.0;
  local_300.m_basis.m_el[2].m_floats[0] = 0.0;
  local_300.m_basis.m_el[2].m_floats[1] = 0.0;
  local_300.m_basis.m_el[2].m_floats[2] = 1.0;
  local_300.m_basis.m_el[2].m_floats[3] = 0.0;
  local_300.m_origin.m_floats[0] = 0.0;
  local_300.m_origin.m_floats[1] = 0.0;
  local_300.m_origin.m_floats[2] = 0.0;
  local_300.m_origin.m_floats[3] = 0.0;
  local_2c0._vptr_CastResult = (_func_int **)&PTR_DebugDraw_00b6ffb0;
  local_2c0.m_debugDrawer = (cbtIDebugDraw *)0x0;
  local_2c0.m_allowedPenetration = 0.0;
  local_2c0.m_subSimplexCastMaxIterations = 0x20;
  local_2c0.m_subSimplexCastEpsilon = 0.0001;
  local_2c0.m_fraction = this->m_hitFraction;
  local_36c = this->m_ccdSphereRadius;
  cbtConvexInternalShape::cbtConvexInternalShape(&local_368);
  local_368.super_cbtConvexShape.super_cbtCollisionShape._vptr_cbtCollisionShape =
       (_func_int **)&PTR__cbtConvexShape_00b72170;
  local_368.super_cbtConvexShape.super_cbtCollisionShape.m_shapeType = 8;
  local_368.super_cbtConvexShape.super_cbtCollisionShape._28_4_ = 0x3f800000;
  local_368._32_4_ = 0x3f800000;
  local_368._36_4_ = 0x3f800000;
  local_368.m_implicitShapeDimensions.m_floats[1] = 0.0;
  local_368.m_implicitShapeDimensions.m_floats[2] = 0.0;
  local_368.m_implicitShapeDimensions.m_floats[3] = 0.0;
  local_368._40_8_ = (ulong)(uint)local_36c << 0x20;
  local_368.m_collisionMargin = local_36c;
  local_368.m_padding = 0.0;
  cbtPolyhedralConvexShape::cbtPolyhedralConvexShape(&local_1f8);
  local_1f8.super_cbtConvexInternalShape.super_cbtConvexShape.super_cbtCollisionShape.
  _vptr_cbtCollisionShape = (_func_int **)&PTR__cbtPolyhedralConvexShape_00b70638;
  local_1f8.super_cbtConvexInternalShape.super_cbtConvexShape.super_cbtCollisionShape.m_shapeType =
       1;
  local_1a8 = *(undefined8 *)triangle->m_floats;
  uStack_1a0 = *(undefined8 *)(triangle->m_floats + 2);
  local_198 = *(undefined8 *)triangle[1].m_floats;
  uStack_190 = *(undefined8 *)(triangle[1].m_floats + 2);
  local_188 = *(undefined8 *)triangle[2].m_floats;
  uStack_180 = *(undefined8 *)(triangle[2].m_floats + 2);
  local_178.m_equalVertexThreshold = 0.0001;
  local_178.m_cachedBC.m_usedVertices._0_1_ = local_178.m_cachedBC.m_usedVertices._0_1_ & 0xf0;
  cbtSubsimplexConvexCast::cbtSubsimplexConvexCast
            (&local_320,&local_368.super_cbtConvexShape,(cbtConvexShape *)&local_1f8,&local_178);
  bVar1 = cbtSubsimplexConvexCast::calcTimeOfImpact
                    (&local_320,&this->m_ccdSphereFromTrans,&this->m_ccdSphereToTrans,&local_300,
                     &local_300,&local_2c0);
  if ((bVar1) && (local_2c0.m_fraction < this->m_hitFraction)) {
    this->m_hitFraction = local_2c0.m_fraction;
  }
  cbtConvexCast::~cbtConvexCast(&local_320.super_cbtConvexCast);
  cbtPolyhedralConvexShape::~cbtPolyhedralConvexShape(&local_1f8);
  cbtConvexShape::~cbtConvexShape(&local_368.super_cbtConvexShape);
  CProfileSample::~CProfileSample(&local_36d);
  return;
}

Assistant:

virtual void processTriangle(cbtVector3* triangle, int partId, int triangleIndex)
		{
			BT_PROFILE("processTriangle");
			(void)partId;
			(void)triangleIndex;
			//do a swept sphere for now
			cbtTransform ident;
			ident.setIdentity();
			cbtConvexCast::CastResult castResult;
			castResult.m_fraction = m_hitFraction;
			cbtSphereShape pointShape(m_ccdSphereRadius);
			cbtTriangleShape triShape(triangle[0], triangle[1], triangle[2]);
			cbtVoronoiSimplexSolver simplexSolver;
			cbtSubsimplexConvexCast convexCaster(&pointShape, &triShape, &simplexSolver);
			//GjkConvexCast	convexCaster(&pointShape,convexShape,&simplexSolver);
			//ContinuousConvexCollision convexCaster(&pointShape,convexShape,&simplexSolver,0);
			//local space?

			if (convexCaster.calcTimeOfImpact(m_ccdSphereFromTrans, m_ccdSphereToTrans,
											  ident, ident, castResult))
			{
				if (m_hitFraction > castResult.m_fraction)
					m_hitFraction = castResult.m_fraction;
			}
		}